

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int get_pattr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_union *value)

{
  attr_union *paVar1;
  short sVar2;
  attr_list *pp_Var3;
  int_attr_struct *piVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  sVar2 = list->list_of_lists;
  while( true ) {
    if (sVar2 == 0) {
      piVar4 = (list->l).list.iattrs;
      if (index < (int)(uint)piVar4->int_attr_count) {
        *name = piVar4->iattr[index].attr_id;
        *val_type = Attr_Int4;
        (value->u).f = (float)((list->l).list.iattrs)->iattr[index].value;
      }
      else {
        lVar7 = (long)index - (ulong)piVar4->int_attr_count;
        if ((int)(uint)piVar4->other_attr_count <= (int)lVar7) {
          return 0;
        }
        *name = (list->l).list.attributes[lVar7].attr_id;
        *val_type = (list->l).list.attributes[lVar7].val_type;
        paVar1 = &(list->l).list.attributes[lVar7].value;
        pvVar5 = (paVar1->u).o.buffer;
        (value->u).d = (paVar1->u).d;
        (value->u).o.buffer = pvVar5;
      }
      return 1;
    }
    lVar7 = (long)(list->l).lists.sublist_count;
    if (lVar7 < 1) break;
    pp_Var3 = (list->l).lists.lists;
    lVar8 = 0;
    while( true ) {
      list = pp_Var3[lVar8];
      iVar6 = attr_count(list);
      if (index < iVar6) break;
      lVar8 = lVar8 + 1;
      index = index - iVar6;
      if (lVar7 == lVar8) {
        return 0;
      }
    }
    sVar2 = list->list_of_lists;
  }
  return 0;
}

Assistant:

int
get_pattr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_union *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    value->u.i = list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = list->l.list.attributes[index].value;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_pattr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}